

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_client.c
# Opt level: O0

void http_txn_cb(void *arg)

{
  nng_err rv_00;
  int iVar1;
  char *pcVar2;
  void *__src;
  size_t __n;
  size_t sVar3;
  nni_http_chunk *local_60;
  nni_http_chunk *chunk;
  size_t sz;
  char *dst;
  nni_iov iov;
  uint64_t len;
  char *pcStack_28;
  nng_err rv;
  char *end;
  char *str;
  http_txn *txn;
  void *arg_local;
  
  local_60 = (nni_http_chunk *)0x0;
  str = (char *)arg;
  txn = (http_txn *)arg;
  nni_mtx_lock(&http_txn_lk);
  rv_00 = nni_aio_result((nni_aio *)str);
  if (rv_00 != NNG_OK) {
    http_txn_finish_aios((http_txn *)str,rv_00);
    nni_mtx_unlock(&http_txn_lk);
    http_txn_fini((http_txn *)str);
    return;
  }
  switch(*(undefined4 *)(str + 0x200)) {
  case 0:
    str[0x200] = '\x01';
    str[0x201] = '\0';
    str[0x202] = '\0';
    str[0x203] = '\0';
    nni_http_read_res(*(nni_http_conn **)(str + 0x1e8),(nni_aio *)str);
    nni_mtx_unlock(&http_txn_lk);
    return;
  case 1:
    pcVar2 = nni_http_get_method(*(nng_http **)(str + 0x1e8));
    iVar1 = strcmp(pcVar2,"HEAD");
    if (((iVar1 == 0) ||
        (end = nni_http_get_header(*(nng_http **)(str + 0x1e8),"Transfer-Encoding"),
        end == (char *)0x0)) || (pcVar2 = strstr(end,"chunked"), pcVar2 == (char *)0x0)) {
      pcVar2 = nni_http_get_method(*(nng_http **)(str + 0x1e8));
      iVar1 = strcmp(pcVar2,"HEAD");
      if (((iVar1 == 0) ||
          (end = nni_http_get_header(*(nng_http **)(str + 0x1e8),"Content-Length"),
          end == (char *)0x0)) ||
         ((iov.iov_len = strtoull(end,&stack0xffffffffffffffd8,10), iov.iov_len == 0 ||
          ((pcStack_28 == (char *)0x0 || (*pcStack_28 != '\0')))))) {
        http_txn_finish_aios((http_txn *)str,0);
        nni_mtx_unlock(&http_txn_lk);
        http_txn_fini((http_txn *)str);
        return;
      }
      len._4_4_ = nni_http_res_alloc_data(*(nni_http_res **)(str + 0x1f0),iov.iov_len);
      if (len._4_4_ == NNG_OK) {
        nni_http_get_body(*(nng_http **)(str + 0x1e8),&dst,(size_t *)&iov);
        nni_aio_set_iov((nni_aio *)str,1,(nni_iov *)&dst);
        str[0x200] = '\x02';
        str[0x201] = '\0';
        str[0x202] = '\0';
        str[0x203] = '\0';
        nni_http_read_full(*(nni_http_conn **)(str + 0x1e8),(nni_aio *)str);
        nni_mtx_unlock(&http_txn_lk);
        return;
      }
    }
    else {
      len._4_4_ = nni_http_chunks_init((nni_http_chunks **)(str + 0x1f8),0);
      if (len._4_4_ == NNG_OK) {
        str[0x200] = '\x03';
        str[0x201] = '\0';
        str[0x202] = '\0';
        str[0x203] = '\0';
        nni_http_read_chunks
                  (*(nni_http_conn **)(str + 0x1e8),*(nni_http_chunks **)(str + 0x1f8),
                   (nni_aio *)str);
        nni_mtx_unlock(&http_txn_lk);
        return;
      }
    }
    break;
  case 2:
    http_txn_finish_aios((http_txn *)str,0);
    nni_mtx_unlock(&http_txn_lk);
    http_txn_fini((http_txn *)str);
    return;
  case 3:
    chunk = (nni_http_chunk *)nni_http_chunks_size(*(nni_http_chunks **)(str + 0x1f8));
    len._4_4_ = nni_http_res_alloc_data(*(nni_http_res **)(str + 0x1f0),(size_t)chunk);
    if (len._4_4_ == NNG_OK) {
      nni_http_get_body(*(nng_http **)(str + 0x1e8),(void **)&sz,(size_t *)&chunk);
      while (local_60 = nni_http_chunks_iter(*(nni_http_chunks **)(str + 0x1f8),local_60),
            sVar3 = sz, local_60 != (nni_http_chunk *)0x0) {
        __src = nni_http_chunk_data(local_60);
        __n = nni_http_chunk_size(local_60);
        memcpy((void *)sVar3,__src,__n);
        sVar3 = nni_http_chunk_size(local_60);
        sz = sVar3 + sz;
      }
      http_txn_finish_aios((http_txn *)str,0);
      nni_mtx_unlock(&http_txn_lk);
      http_txn_fini((http_txn *)str);
      return;
    }
    break;
  default:
    len._4_4_ = NNG_OK;
  }
  http_txn_finish_aios((http_txn *)str,len._4_4_);
  nni_http_conn_close(*(nni_http_conn **)(str + 0x1e8));
  nni_mtx_unlock(&http_txn_lk);
  http_txn_fini((http_txn *)str);
  return;
}

Assistant:

static void
http_txn_cb(void *arg)
{
	http_txn       *txn = arg;
	const char     *str;
	char           *end;
	nng_err         rv;
	uint64_t        len;
	nni_iov         iov;
	char           *dst;
	size_t          sz;
	nni_http_chunk *chunk = NULL;

	nni_mtx_lock(&http_txn_lk);
	if ((rv = nni_aio_result(&txn->aio)) != NNG_OK) {
		http_txn_finish_aios(txn, rv);
		nni_mtx_unlock(&http_txn_lk);
		http_txn_fini(txn);
		return;
	}
	switch (txn->state) {
	case HTTP_SENDING:
		txn->state = HTTP_RECVING;
		nni_http_read_res(txn->conn, &txn->aio);
		nni_mtx_unlock(&http_txn_lk);
		return;

	case HTTP_RECVING:

		// Detect chunked encoding.  You poor bastard.  (Only if not
		// HEAD.)
		if ((strcmp(nni_http_get_method(txn->conn), "HEAD") != 0) &&
		    ((str = nni_http_get_header(
		          txn->conn, "Transfer-Encoding")) != NULL) &&
		    (strstr(str, "chunked") != NULL)) {

			if ((rv = nni_http_chunks_init(&txn->chunks, 0)) !=
			    NNG_OK) {
				goto error;
			}
			txn->state = HTTP_RECVING_CHUNKS;
			nni_http_read_chunks(
			    txn->conn, txn->chunks, &txn->aio);
			nni_mtx_unlock(&http_txn_lk);
			return;
		}

		if ((strcmp(nni_http_get_method(txn->conn), "HEAD") == 0) ||
		    ((str = nni_http_get_header(
		          txn->conn, "Content-Length")) == NULL) ||
		    ((len = (uint64_t) strtoull(str, &end, 10)) == 0) ||
		    (end == NULL) || (*end != '\0')) {
			// If no content-length, or HEAD (which per RFC
			// never transfers data), then we are done.
			http_txn_finish_aios(txn, 0);
			nni_mtx_unlock(&http_txn_lk);
			http_txn_fini(txn);
			return;
		}

		if ((rv = nni_http_res_alloc_data(txn->res, (size_t) len)) !=
		    NNG_OK) {
			goto error;
		}
		nni_http_get_body(txn->conn, &iov.iov_buf, &iov.iov_len);
		nni_aio_set_iov(&txn->aio, 1, &iov);
		txn->state = HTTP_RECVING_BODY;
		nni_http_read_full(txn->conn, &txn->aio);
		nni_mtx_unlock(&http_txn_lk);
		return;

	case HTTP_RECVING_BODY:
		// All done!
		http_txn_finish_aios(txn, 0);
		nni_mtx_unlock(&http_txn_lk);
		http_txn_fini(txn);
		return;

	case HTTP_RECVING_CHUNKS:
		// All done, but now we need to coalesce the chunks, for
		// yet *another* copy.  Chunked transfers are such crap.
		sz = nni_http_chunks_size(txn->chunks);
		if ((rv = nni_http_res_alloc_data(txn->res, sz)) != 0) {
			goto error;
		}
		nni_http_get_body(txn->conn, (void **) &dst, &sz);
		while ((chunk = nni_http_chunks_iter(txn->chunks, chunk)) !=
		    NULL) {
			memcpy(dst, nni_http_chunk_data(chunk),
			    nni_http_chunk_size(chunk));
			dst += nni_http_chunk_size(chunk);
		}
		http_txn_finish_aios(txn, 0);
		nni_mtx_unlock(&http_txn_lk);
		http_txn_fini(txn);
		return;
	}

error:
	http_txn_finish_aios(txn, rv);
	nni_http_conn_close(txn->conn);
	nni_mtx_unlock(&http_txn_lk);
	http_txn_fini(txn);
}